

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate.h
# Opt level: O0

TString * __thiscall
glslang::TIntermOperator::getCompleteString_abi_cxx11_
          (TString *__return_storage_ptr__,TIntermOperator *this)

{
  TPrecisionQualifier TVar1;
  TQualifier *pTVar2;
  char *__s;
  pool_allocator<char> local_80;
  TString local_78;
  pool_allocator<char> local_50;
  TString local_48;
  undefined1 local_19;
  TIntermOperator *local_18;
  TIntermOperator *this_local;
  TString *cs;
  
  local_19 = 0;
  local_18 = this;
  this_local = (TIntermOperator *)__return_storage_ptr__;
  pool_allocator<char>::pool_allocator(&local_50);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_48,""
             ,&local_50);
  pool_allocator<char>::pool_allocator(&local_80);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_78,""
             ,&local_80);
  TType::getCompleteString
            (__return_storage_ptr__,&(this->super_TIntermTyped).type,false,true,true,true,&local_48,
             &local_78);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_78);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_48);
  TVar1 = getOperationPrecision(this);
  pTVar2 = TType::getQualifier(&(this->super_TIntermTyped).type);
  if (TVar1 != ((TPrecisionQualifier)(*(ulong *)&pTVar2->field_0x8 >> 0x19) & 7)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=(__return_storage_ptr__,", operation at ");
    TVar1 = getOperationPrecision(this);
    __s = GetPrecisionQualifierString(TVar1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator+=(__return_storage_ptr__,__s);
  }
  return __return_storage_ptr__;
}

Assistant:

TString getCompleteString() const
    {
        TString cs = type.getCompleteString();
        if (getOperationPrecision() != type.getQualifier().precision) {
            cs += ", operation at ";
            cs += GetPrecisionQualifierString(getOperationPrecision());
        }

        return cs;
    }